

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rnn.c
# Opt level: O2

int findvidx(rnndb *db,rnnenum *en,char *name)

{
  int iVar1;
  ulong uVar2;
  ulong uVar3;
  
  uVar3 = 0;
  uVar2 = (ulong)(uint)en->valsnum;
  if (en->valsnum < 1) {
    uVar2 = uVar3;
  }
  for (; uVar2 != uVar3; uVar3 = uVar3 + 1) {
    iVar1 = strcmp(en->vals[uVar3]->name,name);
    if (iVar1 == 0) goto LAB_0017158e;
  }
  fprintf(_stderr,"Cannot find variant %s in enum %s!\n",name,en->name);
  db->estatus = 1;
  uVar3 = 0xffffffffffffffff;
LAB_0017158e:
  return (int)uVar3;
}

Assistant:

static int findvidx (struct rnndb *db, struct rnnenum *en, char *name) {
	int i;
	for (i = 0; i < en->valsnum; i++)
		if (!strcmp(en->vals[i]->name, name))
			return i;
	fprintf (stderr, "Cannot find variant %s in enum %s!\n", name, en->name);
	db->estatus = 1;
	return -1;
}